

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestIncrementF<Counter<unsigned_short,10u>>(void)

{
  Counter<unsigned_short,_10U> local_5a;
  uint local_58;
  uint local_54;
  uint ii_2;
  uint ii_1;
  Counter<unsigned_short,_10U> local_46;
  uint ii;
  Counter<unsigned_short,_10U> b;
  Counter<unsigned_short,_10U> a;
  
  Counter<unsigned_short,_10U>::Counter((Counter<unsigned_short,_10U> *)&ii,0x3fa);
  Counter<unsigned_short,_10U>::Counter(&local_46,(ThisType *)&ii);
  for (ii_1 = 0; ii_1 < 5; ii_1 = ii_1 + 1) {
    ii._0_2_ = (ushort)ii + 1 & 0x3ff;
  }
  Counter<unsigned_short,_10U>::Counter((Counter<unsigned_short,_10U> *)((long)&ii_2 + 2),0x3ff);
  if ((ushort)ii == ii_2._2_2_) {
    for (local_54 = 0; local_54 < 5; local_54 = local_54 + 1) {
      ii._0_2_ = (ushort)ii + 1 & 0x3ff;
    }
    for (local_58 = 0; local_58 < 10; local_58 = local_58 + 1) {
      ii._0_2_ = (ushort)ii - 1 & 0x3ff;
    }
    Counter<unsigned_short,_10U>::Counter(&local_5a,&local_46);
    if ((ushort)ii == local_5a.Value) {
      ii._3_1_ = true;
    }
    else {
      ii._3_1_ = false;
    }
  }
  else {
    ii._3_1_ = false;
  }
  return ii._3_1_;
}

Assistant:

bool TestIncrementF()
{
    CounterT a = CounterT::kMask - 5;
    const CounterT b = a;

    for (unsigned ii = 0; ii < 5; ++ii)
        ++a;

    TEST_CHECK(a == CounterT::kMask);

    for (unsigned ii = 0; ii < 5; ++ii)
        ++a;
    for (unsigned ii = 0; ii < 10; ++ii)
        --a;

    TEST_CHECK(a == b);

    return true;
}